

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall deqp::sl::ShaderParser::advanceToken(ShaderParser *this)

{
  string *__lhs;
  byte bVar1;
  char *__s;
  long lVar2;
  char endChar;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  long lVar6;
  byte *pbVar7;
  byte *__s2;
  byte *pbVar8;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_curPtr = this->m_curPtr + (this->m_curTokenStr)._M_string_length;
  __lhs = &this->m_curTokenStr;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::assign((char *)__lhs);
  __s2 = (byte *)this->m_curPtr;
  while( true ) {
    bVar1 = *__s2;
    uVar5 = (ulong)bVar1;
    if (0x23 < uVar5) break;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 != 0x23) {
        if (uVar5 == 0) {
          this->m_curToken = TOKEN_EOF;
          goto LAB_00d62240;
        }
        break;
      }
      while ((pbVar8 = __s2 + 1, 0xd < (byte)uVar5 || ((0x2401U >> ((uint)uVar5 & 0x1f) & 1) == 0)))
      {
        this->m_curPtr = (char *)pbVar8;
        uVar5 = (ulong)*pbVar8;
        __s2 = pbVar8;
      }
    }
    else {
      __s2 = __s2 + 1;
      this->m_curPtr = (char *)__s2;
    }
  }
  pbVar8 = __s2;
  if (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)) {
    do {
      do {
        pbVar8 = pbVar8 + 1;
        bVar1 = *pbVar8;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar1 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)
             )));
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2);
    std::__cxx11::string::operator=((string *)__lhs,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    this->m_curToken = TOKEN_IDENTIFIER;
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      if (lVar6 + 0x10 == 0x290) {
        return;
      }
      bVar3 = std::operator==(__lhs,*(char **)((long)&advanceToken::s_named[0].str + lVar6));
      lVar2 = lVar6 + 0x10;
    } while (!bVar3);
    this->m_curToken = *(Token *)((long)&advanceToken::s_named[0].token + lVar6);
    return;
  }
  if (0xf5 < (byte)(bVar1 - 0x3a)) {
    do {
      pbVar7 = pbVar8;
      pbVar8 = pbVar7 + 1;
    } while (0xf5 < (byte)(*pbVar7 - 0x3a));
    if (*pbVar7 == 0x2e) {
      do {
        pbVar7 = pbVar8;
        pbVar8 = pbVar7 + 1;
      } while (0xf5 < (byte)(*pbVar7 - 0x3a));
      if ((*pbVar7 | 0x20) == 0x65) {
        if ((*pbVar8 == 0x2b) || (*pbVar8 == 0x2d)) {
          pbVar8 = pbVar7 + 2;
        }
        pbVar7 = pbVar8 + -1;
        do {
          pbVar8 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
        } while (0xf5 < (byte)(*pbVar8 - 0x3a));
      }
      this->m_curToken = TOKEN_FLOAT_LITERAL;
    }
    else {
      this->m_curToken = TOKEN_INT_LITERAL;
    }
    goto LAB_00d6248b;
  }
  if (bVar1 == 0x22) {
    if (__s2[1] != 0x22) goto LAB_00d62410;
    for (pbVar8 = __s2 + 2; (*pbVar8 != 0x22 || (pbVar8[1] != 0x22));
        pbVar8 = pbVar8 + (ulong)(*pbVar8 == 0x5c) + 1) {
    }
    this->m_curToken = TOKEN_SHADER_SOURCE;
    iVar4 = ((int)pbVar8 - (int)__s2) + 2;
  }
  else {
    if (bVar1 != 0x27) {
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        if (lVar6 + 0x10 == 0xd0) {
          this->m_curToken = TOKEN_INVALID;
          std::__cxx11::string::operator=((string *)__lhs,*__s2);
          return;
        }
        __s = *(char **)((long)&advanceToken::s_simple[0].str + lVar6);
        __n = strlen(__s);
        iVar4 = strncmp(__s,(char *)__s2,__n);
        lVar2 = lVar6 + 0x10;
      } while (iVar4 != 0);
      this->m_curToken = *(Token *)((long)&advanceToken::s_simple[0].token + lVar6);
LAB_00d62240:
      std::__cxx11::string::assign((char *)__lhs);
      return;
    }
LAB_00d62410:
    while( true ) {
      pbVar8 = pbVar8 + 1;
      if (*pbVar8 == bVar1) break;
      pbVar8 = pbVar8 + (*pbVar8 == 0x5c);
    }
    this->m_curToken = TOKEN_STRING;
    iVar4 = ((int)pbVar8 - (int)__s2) + 1;
  }
  pbVar7 = __s2 + iVar4;
LAB_00d6248b:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s2,pbVar7);
  std::__cxx11::string::operator=((string *)__lhs,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void ShaderParser::advanceToken(void)
{
	// Skip old token.
	m_curPtr += m_curTokenStr.length();

	// Reset token (for safety).
	m_curToken	= TOKEN_INVALID;
	m_curTokenStr = "";

	// Eat whitespace & comments while they last.
	for (;;)
	{
		while (isWhitespace(*m_curPtr))
			m_curPtr++;

		// Check for EOL comment.
		if (*m_curPtr == '#')
		{
			while (*m_curPtr && !isEOL(*m_curPtr))
				m_curPtr++;
		}
		else
			break;
	}

	if (!*m_curPtr)
	{
		m_curToken	= TOKEN_EOF;
		m_curTokenStr = "<EOF>";
	}
	else if (isAlpha(*m_curPtr))
	{
		struct Named
		{
			const char* str;
			Token		token;
		};

		static const Named s_named[] = { { "true", TOKEN_TRUE },
										 { "false", TOKEN_FALSE },
										 { "desc", TOKEN_DESC },
										 { "expect", TOKEN_EXPECT },
										 { "group", TOKEN_GROUP },
										 { "case", TOKEN_CASE },
										 { "end", TOKEN_END },
										 { "values", TOKEN_VALUES },
										 { "both", TOKEN_BOTH },
										 { "vertex", TOKEN_VERTEX },
										 { "fragment", TOKEN_FRAGMENT },
										 { "uniform", TOKEN_UNIFORM },
										 { "input", TOKEN_INPUT },
										 { "output", TOKEN_OUTPUT },
										 { "float", TOKEN_FLOAT },
										 { "vec2", TOKEN_FLOAT_VEC2 },
										 { "vec3", TOKEN_FLOAT_VEC3 },
										 { "vec4", TOKEN_FLOAT_VEC4 },
										 { "mat2", TOKEN_FLOAT_MAT2 },
										 { "mat2x3", TOKEN_FLOAT_MAT2X3 },
										 { "mat2x4", TOKEN_FLOAT_MAT2X4 },
										 { "mat3x2", TOKEN_FLOAT_MAT3X2 },
										 { "mat3", TOKEN_FLOAT_MAT3 },
										 { "mat3x4", TOKEN_FLOAT_MAT3X4 },
										 { "mat4x2", TOKEN_FLOAT_MAT4X2 },
										 { "mat4x3", TOKEN_FLOAT_MAT4X3 },
										 { "mat4", TOKEN_FLOAT_MAT4 },
										 { "int", TOKEN_INT },
										 { "ivec2", TOKEN_INT_VEC2 },
										 { "ivec3", TOKEN_INT_VEC3 },
										 { "ivec4", TOKEN_INT_VEC4 },
										 { "uint", TOKEN_UINT },
										 { "uvec2", TOKEN_UINT_VEC2 },
										 { "uvec3", TOKEN_UINT_VEC3 },
										 { "uvec4", TOKEN_UINT_VEC4 },
										 { "bool", TOKEN_BOOL },
										 { "bvec2", TOKEN_BOOL_VEC2 },
										 { "bvec3", TOKEN_BOOL_VEC3 },
										 { "bvec4", TOKEN_BOOL_VEC4 },
										 { "version", TOKEN_VERSION } };

		const char* end = m_curPtr + 1;
		while (isCaseNameChar(*end))
			end++;
		m_curTokenStr = string(m_curPtr, end - m_curPtr);

		m_curToken = TOKEN_IDENTIFIER;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_named); ndx++)
		{
			if (m_curTokenStr == s_named[ndx].str)
			{
				m_curToken = s_named[ndx].token;
				break;
			}
		}
	}
	else if (isNumeric(*m_curPtr))
	{
		/* \todo [2010-03-31 petri] Hex? */
		const char* p = m_curPtr;
		while (isNumeric(*p))
			p++;
		if (*p == '.')
		{
			p++;
			while (isNumeric(*p))
				p++;

			if (*p == 'e' || *p == 'E')
			{
				p++;
				if (*p == '+' || *p == '-')
					p++;
				DE_ASSERT(isNumeric(*p));
				while (isNumeric(*p))
					p++;
			}

			m_curToken	= TOKEN_FLOAT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
		else
		{
			m_curToken	= TOKEN_INT_LITERAL;
			m_curTokenStr = string(m_curPtr, p - m_curPtr);
		}
	}
	else if (*m_curPtr == '"' && m_curPtr[1] == '"')
	{
		const char* p = m_curPtr + 2;

		while ((p[0] != '"') || (p[1] != '"'))
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p += 2;

		m_curToken	= TOKEN_SHADER_SOURCE;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else if (*m_curPtr == '"' || *m_curPtr == '\'')
	{
		char		endChar = *m_curPtr;
		const char* p		= m_curPtr + 1;

		while (*p != endChar)
		{
			DE_ASSERT(*p);
			if (*p == '\\')
			{
				DE_ASSERT(p[1] != 0);
				p += 2;
			}
			else
				p++;
		}
		p++;

		m_curToken	= TOKEN_STRING;
		m_curTokenStr = string(m_curPtr, (int)(p - m_curPtr));
	}
	else
	{
		struct SimpleToken
		{
			const char* str;
			Token		token;
		};

		static const SimpleToken s_simple[] = { { "=", TOKEN_ASSIGN },		 { "+", TOKEN_PLUS },
												{ "-", TOKEN_MINUS },		 { ",", TOKEN_COMMA },
												{ "|", TOKEN_VERTICAL_BAR }, { ";", TOKEN_SEMI_COLON },
												{ "(", TOKEN_LEFT_PAREN },   { ")", TOKEN_RIGHT_PAREN },
												{ "[", TOKEN_LEFT_BRACKET }, { "]", TOKEN_RIGHT_BRACKET },
												{ "{", TOKEN_LEFT_BRACE },   { "}", TOKEN_RIGHT_BRACE } };

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_simple); ndx++)
		{
			if (strncmp(s_simple[ndx].str, m_curPtr, strlen(s_simple[ndx].str)) == 0)
			{
				m_curToken	= s_simple[ndx].token;
				m_curTokenStr = s_simple[ndx].str;
				return;
			}
		}

		// Otherwise invalid token.
		m_curToken	= TOKEN_INVALID;
		m_curTokenStr = *m_curPtr;
	}
}